

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O0

void sprkStep_Free(ARKodeMem ark_mem)

{
  long lVar1;
  long in_RDI;
  ARKodeSPRKStepMem step_mem;
  N_Vector *in_stack_ffffffffffffffe8;
  ARKodeMem ark_mem_00;
  
  if ((in_RDI != 0) && (*(long *)(in_RDI + 0x88) != 0)) {
    ark_mem_00 = *(ARKodeMem *)(in_RDI + 0x88);
    if (ark_mem_00->user_data != (void *)0x0) {
      arkFreeVec(ark_mem_00,in_stack_ffffffffffffffe8);
      ark_mem_00->user_data = (void *)0x0;
    }
    lVar1._0_4_ = ark_mem_00->itol;
    lVar1._4_4_ = ark_mem_00->ritol;
    if (lVar1 != 0) {
      arkFreeVec(ark_mem_00,in_stack_ffffffffffffffe8);
      ark_mem_00->itol = 0;
      ark_mem_00->ritol = 0;
    }
    ARKodeSPRKTable_Free((ARKodeSPRKTable)0x175a88);
    free(*(void **)(in_RDI + 0x88));
    *(undefined8 *)(in_RDI + 0x88) = 0;
  }
  return;
}

Assistant:

void sprkStep_Free(ARKodeMem ark_mem)
{
  ARKodeSPRKStepMem step_mem = NULL;

  /* nothing to do if ark_mem is already NULL */
  if (ark_mem == NULL) { return; }

  /* conditional frees on non-NULL SPRKStep module */
  if (ark_mem->step_mem != NULL)
  {
    step_mem = (ARKodeSPRKStepMem)ark_mem->step_mem;

    if (step_mem->sdata != NULL)
    {
      arkFreeVec(ark_mem, &step_mem->sdata);
      step_mem->sdata = NULL;
    }

    if (step_mem->yerr != NULL)
    {
      arkFreeVec(ark_mem, &step_mem->yerr);
      step_mem->yerr = NULL;
    }

    ARKodeSPRKTable_Free(step_mem->method);

    free(ark_mem->step_mem);
    ark_mem->step_mem = NULL;
  }
}